

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O3

int Io_ReadBlifNetworkConnectBoxesOneBox(Io_ReadBlif_t *p,Abc_Obj_t *pBox,stmm_table *tName2Model)

{
  void *pvVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  Abc_Obj_t *pAVar5;
  undefined8 uVar6;
  void *pvVar7;
  uint uVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  Abc_Ntk_t *pNtkModel;
  char *local_48;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 local_38;
  
  pvVar7 = (pBox->field_5).pData;
  if (*(int *)((long)pvVar7 + 4) < 1) {
LAB_0032f6fd:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  iVar2 = stmm_lookup(tName2Model,(char *)**(undefined8 **)((long)pvVar7 + 8),
                      (char **)&local_38.pData);
  if (iVar2 == 0) {
    p->LineCur = (pBox->field_6).iTemp;
    if (0 < *(int *)((long)pvVar7 + 4)) {
      sprintf(p->sError,"Cannot find the model for subcircuit %s.",
              **(undefined8 **)((long)pvVar7 + 8));
      goto LAB_0032f618;
    }
    goto LAB_0032f6fd;
  }
  lVar12 = *(long *)((long)local_38.pData + 0x28);
  iVar2 = *(int *)(lVar12 + 4);
  if (0 < iVar2) {
    lVar9 = 0;
    do {
      *(undefined8 *)(*(long *)(*(long *)(lVar12 + 8) + lVar9 * 8) + 0x40) = 0;
      lVar9 = lVar9 + 1;
      lVar12 = *(long *)((long)local_38.pData + 0x28);
      iVar2 = *(int *)(lVar12 + 4);
    } while (lVar9 < iVar2);
  }
  if (iVar2 == 0) {
    uVar8 = 1;
  }
  else {
    uVar8 = 0xffffffff;
    if (1 < *(int *)((long)pvVar7 + 4)) {
      uVar11 = 1;
      do {
        local_48 = *(char **)(*(long *)((long)pvVar7 + 8) + uVar11 * 8);
        sVar3 = strlen(local_48);
        if ((int)(uint)sVar3 < 1) goto LAB_0032f58a;
        uVar4 = (ulong)((uint)sVar3 & 0x7fffffff);
        lVar12 = 0;
        pcVar10 = local_48;
        while (*pcVar10 != '=') {
          lVar12 = lVar12 + 0x100000000;
          uVar4 = uVar4 - 1;
          pcVar10 = pcVar10 + 1;
          if (uVar4 == 0) goto LAB_0032f58a;
        }
        local_48[lVar12 >> 0x20] = '\0';
        pAVar5 = Abc_NtkFindNet((Abc_Ntk_t *)local_38.pData,local_48);
        if (pAVar5 == (Abc_Obj_t *)0x0) {
          p->LineCur = (pBox->field_6).iTemp;
          if (*(int *)((long)pvVar7 + 4) < 1) goto LAB_0032f6fd;
          uVar6 = **(undefined8 **)((long)pvVar7 + 8);
          pcVar10 = "Cannot find formal input \"%s\" as an PI of model \"%s\".";
          goto LAB_0032f6ce;
        }
        pvVar1 = pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
        if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) != 2) {
          local_48[lVar12 >> 0x20] = '=';
          lVar12 = *(long *)((long)local_38.pData + 0x28);
LAB_0032f697:
          uVar8 = (uint)uVar11;
          goto LAB_0032f368;
        }
        if (*(long *)((long)pvVar1 + 0x40) != 0) {
          p->LineCur = (pBox->field_6).iTemp;
          pcVar10 = "Formal input \"%s\" is used more than once.";
          goto LAB_0032f5a4;
        }
        *(char **)((long)pvVar1 + 0x40) = pcVar10 + 1;
        lVar12 = *(long *)((long)local_38.pData + 0x28);
        if (uVar11 == *(uint *)(lVar12 + 4)) {
          uVar11 = (ulong)((int)uVar11 + 1);
          goto LAB_0032f697;
        }
        uVar11 = uVar11 + 1;
      } while ((long)uVar11 < (long)*(int *)((long)pvVar7 + 4));
      uVar8 = 0xffffffff;
      goto LAB_0032f368;
    }
  }
  local_48 = (char *)0x0;
LAB_0032f368:
  if (0 < *(int *)(lVar12 + 4)) {
    lVar9 = 0;
    do {
      pcVar10 = *(char **)(*(long *)(*(long *)(lVar12 + 8) + lVar9 * 8) + 0x40);
      if (pcVar10 == (char *)0x0) {
        p->LineCur = (pBox->field_6).iTemp;
        if (*(int *)((long)pvVar7 + 4) < 1) goto LAB_0032f6fd;
        uVar6 = **(undefined8 **)((long)pvVar7 + 8);
        pcVar10 = "Formal input \"%s\" of model %s is not driven.";
        goto LAB_0032f60a;
      }
      pAVar5 = Abc_NtkFindOrCreateNet(pBox->pNtk,pcVar10);
      Abc_ObjAddFanin(pBox,pAVar5);
      lVar9 = lVar9 + 1;
      lVar12 = *(long *)((long)local_38.pData + 0x28);
    } while (lVar9 < *(int *)(lVar12 + 4));
    if (0 < *(int *)(lVar12 + 4)) {
      lVar9 = 0;
      do {
        *(undefined8 *)(*(long *)(*(long *)(lVar12 + 8) + lVar9 * 8) + 0x40) = 0;
        lVar9 = lVar9 + 1;
        lVar12 = *(long *)((long)local_38.pData + 0x28);
      } while (lVar9 < *(int *)(lVar12 + 4));
    }
  }
  lVar12 = *(long *)((long)local_38.pData + 0x30);
  if (0 < *(int *)(lVar12 + 4)) {
    lVar9 = 0;
    do {
      *(undefined8 *)(*(long *)(*(long *)(lVar12 + 8) + lVar9 * 8) + 0x40) = 0;
      lVar9 = lVar9 + 1;
      lVar12 = *(long *)((long)local_38.pData + 0x30);
    } while (lVar9 < *(int *)(lVar12 + 4));
  }
  if ((int)uVar8 < *(int *)((long)pvVar7 + 4)) {
    uVar11 = (ulong)uVar8;
    do {
      if ((int)uVar8 < 0) goto LAB_0032f6fd;
      local_48 = *(char **)(*(long *)((long)pvVar7 + 8) + uVar11 * 8);
      sVar3 = strlen(local_48);
      if ((int)(uint)sVar3 < 1) goto LAB_0032f58a;
      uVar4 = (ulong)((uint)sVar3 & 0x7fffffff);
      lVar12 = 0;
      pcVar10 = local_48;
      while (*pcVar10 != '=') {
        lVar12 = lVar12 + 0x100000000;
        uVar4 = uVar4 - 1;
        pcVar10 = pcVar10 + 1;
        if (uVar4 == 0) goto LAB_0032f58a;
      }
      local_48[lVar12 >> 0x20] = '\0';
      pAVar5 = Abc_NtkFindNet((Abc_Ntk_t *)local_38.pData,local_48);
      if (pAVar5 == (Abc_Obj_t *)0x0) {
        p->LineCur = (pBox->field_6).iTemp;
        if (0 < *(int *)((long)pvVar7 + 4)) {
          uVar6 = **(undefined8 **)((long)pvVar7 + 8);
          pcVar10 = "Cannot find formal output \"%s\" as an PO of model \"%s\".";
LAB_0032f6ce:
          sprintf(p->sError,pcVar10,local_48,uVar6);
          goto LAB_0032f618;
        }
        goto LAB_0032f6fd;
      }
      pvVar1 = pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray];
      if (*(long *)((long)pvVar1 + 0x40) != 0) {
        p->LineCur = (pBox->field_6).iTemp;
        pcVar10 = "Formal output \"%s\" is used more than once.";
        goto LAB_0032f5a4;
      }
      *(char **)((long)pvVar1 + 0x40) = pcVar10 + 1;
      uVar11 = uVar11 + 1;
    } while ((int)uVar11 < *(int *)((long)pvVar7 + 4));
    lVar12 = *(long *)((long)local_38.pData + 0x30);
  }
  if (0 < *(int *)(lVar12 + 4)) {
    lVar9 = 0;
    do {
      pcVar10 = *(char **)(*(long *)(*(long *)(lVar12 + 8) + lVar9 * 8) + 0x40);
      if (pcVar10 == (char *)0x0) {
        p->LineCur = (pBox->field_6).iTemp;
        if (0 < *(int *)((long)pvVar7 + 4)) {
          uVar6 = **(undefined8 **)((long)pvVar7 + 8);
          pcVar10 = "Formal output \"%s\" of model %s is not driven.";
LAB_0032f60a:
          sprintf(p->sError,pcVar10,local_48,uVar6);
          goto LAB_0032f618;
        }
        goto LAB_0032f6fd;
      }
      pAVar5 = Abc_NtkFindOrCreateNet(pBox->pNtk,pcVar10);
      Abc_ObjAddFanin(pAVar5,pBox);
      lVar9 = lVar9 + 1;
      lVar12 = *(long *)((long)local_38.pData + 0x30);
    } while (lVar9 < *(int *)(lVar12 + 4));
    if (0 < *(int *)(lVar12 + 4)) {
      lVar9 = 0;
      do {
        *(undefined8 *)(*(long *)(*(long *)(lVar12 + 8) + lVar9 * 8) + 0x40) = 0;
        lVar9 = lVar9 + 1;
        lVar12 = *(long *)((long)local_38.pData + 0x30);
      } while (lVar9 < *(int *)(lVar12 + 4));
    }
  }
  pvVar7 = (pBox->field_5).pData;
  if (0 < *(int *)((long)pvVar7 + 4)) {
    lVar12 = 0;
    do {
      pvVar1 = *(void **)(*(long *)((long)pvVar7 + 8) + lVar12 * 8);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        pvVar7 = (pBox->field_5).pData;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < *(int *)((long)pvVar7 + 4));
  }
  if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
    free(*(void **)((long)pvVar7 + 8));
  }
  free(pvVar7);
  pBox->field_5 = local_38;
  return 0;
LAB_0032f58a:
  p->LineCur = (pBox->field_6).iTemp;
  pcVar10 = "Cannot parse formal/actual name pair \"%s\".";
LAB_0032f5a4:
  sprintf(p->sError,pcVar10,local_48);
LAB_0032f618:
  Io_ReadBlifPrintErrorMessage(p);
  return 1;
}

Assistant:

int Io_ReadBlifNetworkConnectBoxesOneBox( Io_ReadBlif_t * p, Abc_Obj_t * pBox, stmm_table * tName2Model )
{
    Vec_Ptr_t * pNames;
    Abc_Ntk_t * pNtkModel;
    Abc_Obj_t * pObj, * pNet;
    char * pName = NULL, * pActual;
    int i, Length, Start = -1;

    // get the model for this box
    pNames = (Vec_Ptr_t *)pBox->pData;
    if ( !stmm_lookup( tName2Model, (char *)Vec_PtrEntry(pNames, 0), (char **)&pNtkModel ) )
    {
        p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
        sprintf( p->sError, "Cannot find the model for subcircuit %s.", (char*)Vec_PtrEntry(pNames, 0) );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }

    // create the fanins of the box
    Abc_NtkForEachPi( pNtkModel, pObj, i )
        pObj->pCopy = NULL;
    if ( Abc_NtkPiNum(pNtkModel) == 0 )
        Start = 1;
    else
    {
        Vec_PtrForEachEntryStart( char *, pNames, pName, i, 1 )
        {
            pActual = Io_ReadBlifCleanName(pName);
            if ( pActual == NULL )
            {
                p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
                sprintf( p->sError, "Cannot parse formal/actual name pair \"%s\".", pName );
                Io_ReadBlifPrintErrorMessage( p );
                return 1;
            }
            Length = pActual - pName - 1;
            pName[Length] = 0;
            // find the PI net with this name
            pObj = Abc_NtkFindNet( pNtkModel, pName );
            if ( pObj == NULL )
            {
                p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
                sprintf( p->sError, "Cannot find formal input \"%s\" as an PI of model \"%s\".", pName, (char*)Vec_PtrEntry(pNames, 0) );
                Io_ReadBlifPrintErrorMessage( p );
                return 1;
            }
            // get the PI
            pObj = Abc_ObjFanin0(pObj);
            // quit if this is not a PI net
            if ( !Abc_ObjIsPi(pObj) )
            {
                pName[Length] = '=';
                Start = i;
                break;
            }
            // remember the actual name in the net
            if ( pObj->pCopy != NULL )
            {
                p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
                sprintf( p->sError, "Formal input \"%s\" is used more than once.", pName );
                Io_ReadBlifPrintErrorMessage( p );
                return 1;
            }
            pObj->pCopy = (Abc_Obj_t *)pActual;
            // quit if we processed all PIs
            if ( i == Abc_NtkPiNum(pNtkModel) )
            {
                Start = i+1;
                break;
            }
        }
    }
    // create the fanins of the box
    Abc_NtkForEachPi( pNtkModel, pObj, i )
    {
        pActual = (char *)pObj->pCopy;
        if ( pActual == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Formal input \"%s\" of model %s is not driven.", pName, (char*)Vec_PtrEntry(pNames, 0) );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        pNet = Abc_NtkFindOrCreateNet( pBox->pNtk, pActual );
        Abc_ObjAddFanin( pBox, pNet );
    }
    Abc_NtkForEachPi( pNtkModel, pObj, i )
        pObj->pCopy = NULL;

    // create the fanouts of the box
    Abc_NtkForEachPo( pNtkModel, pObj, i )
        pObj->pCopy = NULL;
    Vec_PtrForEachEntryStart( char *, pNames, pName, i, Start )
    {
        pActual = Io_ReadBlifCleanName(pName);
        if ( pActual == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Cannot parse formal/actual name pair \"%s\".", pName );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        Length = pActual - pName - 1;
        pName[Length] = 0;
        // find the PO net with this name
        pObj = Abc_NtkFindNet( pNtkModel, pName );
        if ( pObj == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Cannot find formal output \"%s\" as an PO of model \"%s\".", pName, (char*)Vec_PtrEntry(pNames, 0) );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        // get the PO
        pObj = Abc_ObjFanout0(pObj);
        if ( pObj->pCopy != NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Formal output \"%s\" is used more than once.", pName );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        pObj->pCopy = (Abc_Obj_t *)pActual;
    }
    // create the fanouts of the box
    Abc_NtkForEachPo( pNtkModel, pObj, i )
    {
        pActual = (char *)pObj->pCopy;
        if ( pActual == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Formal output \"%s\" of model %s is not driven.", pName, (char*)Vec_PtrEntry(pNames, 0) );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        pNet = Abc_NtkFindOrCreateNet( pBox->pNtk, pActual );
        Abc_ObjAddFanin( pNet, pBox );
    }
    Abc_NtkForEachPo( pNtkModel, pObj, i )
        pObj->pCopy = NULL;

    // remove the array of names, assign the pointer to the model
    Vec_PtrForEachEntry( char *, (Vec_Ptr_t *)pBox->pData, pName, i )
        ABC_FREE( pName );
    Vec_PtrFree( (Vec_Ptr_t *)pBox->pData );
    pBox->pData = pNtkModel;
    return 0;
}